

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O1

void __thiscall
bloaty::ReadDWARFCompileUnits
          (bloaty *this,File *file,DualMap *symbol_map,CU *skeleton,RangeSink *sink)

{
  pointer pcVar1;
  RangeSink *pRVar2;
  bool bVar3;
  mapped_type *this_00;
  string_view name;
  string_view section;
  string_view section_00;
  InfoReader reader;
  AddressRanges ranges;
  CUIter iter;
  size_type __dnew;
  long *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  uint64_t local_298;
  string local_290;
  long *local_270;
  undefined8 local_268;
  long local_260;
  undefined8 uStack_258;
  File *local_250;
  CU *local_248;
  File *local_240;
  InfoReader local_238;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1b8;
  File **local_180;
  File *local_178;
  File *local_170 [2];
  AddressRanges local_160;
  CUIter local_100;
  CU local_e8;
  
  if (*(long *)(this + 0x30) != 0) {
    if (*(long *)(this + 0x20) != 0) {
      local_238.skeleton_ = (CU *)0x0;
      local_238.stmt_list_map_._M_h._M_buckets = &local_238.stmt_list_map_._M_h._M_single_bucket;
      local_238.stmt_list_map_._M_h._M_bucket_count = 1;
      local_238.stmt_list_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_238.stmt_list_map_._M_h._M_element_count = 0;
      local_238.stmt_list_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_238.stmt_list_map_._M_h._M_rehash_policy._M_next_resize = 0;
      local_238.stmt_list_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_238.abbrev_tables_._M_h._M_buckets = &local_238.abbrev_tables_._M_h._M_single_bucket;
      local_238.abbrev_tables_._M_h._M_bucket_count = 1;
      local_238.abbrev_tables_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_238.abbrev_tables_._M_h._M_element_count = 0;
      local_238.abbrev_tables_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_238.abbrev_tables_._M_h._M_rehash_policy._M_next_resize = 0;
      local_238.abbrev_tables_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_1b8._M_buckets = &local_1b8._M_single_bucket;
      local_1b8._M_bucket_count = 1;
      local_1b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1b8._M_element_count = 0;
      local_1b8._M_rehash_policy._M_max_load_factor = 1.0;
      local_1b8._M_rehash_policy._M_next_resize = 0;
      local_1b8._M_single_bucket = (__node_base_ptr)0x0;
      local_180 = local_170;
      local_e8.dwarf_ = (File *)0x1b;
      local_248 = (CU *)symbol_map;
      local_240 = file;
      local_238.dwarf_ = (File *)this;
      local_180 = (File **)std::__cxx11::string::_M_create((ulong *)&local_180,(ulong)&local_e8);
      local_170[0] = local_e8.dwarf_;
      builtin_strncpy((char *)((long)local_180 + 0xb),"issing f",8);
      builtin_strncpy((char *)((long)local_180 + 0x13),"ilename]",8);
      *local_180 = (File *)0x692046524157445b;
      local_180[1] = (File *)0x6e697373696d2073;
      local_178 = local_e8.dwarf_;
      *(char *)((long)local_180 + (long)local_e8.dwarf_) = '\0';
      local_160.section_._M_len = *(size_t *)(this + 0x20);
      local_160.section_._M_str = *(char **)(this + 0x28);
      local_160.data_._M_len = 0;
      local_160.data_._M_str = (char *)0x0;
      local_160.unit_remaining_._M_len = 0;
      local_160.unit_remaining_._M_str = (char *)0x0;
      local_250 = (File *)this;
      local_160.next_unit_._M_len = local_160.section_._M_len;
      local_160.next_unit_._M_str = local_160.section_._M_str;
      while( true ) {
        bVar3 = dwarf::AddressRanges::NextUnit(&local_160);
        if (!bVar3) break;
        local_298 = local_160.debug_info_offset_;
        this_00 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_1b8,&local_298);
        if (this_00->_M_string_length == 0) {
          local_2b8 = (long *)&local_2a8;
          local_2b0 = 0;
          local_2a8 = 0;
          dwarf::InfoReader::GetCUIter(&local_100,&local_238,kDebugInfo,local_298);
          local_e8.data_._M_len = 0;
          local_e8.data_._M_str = (char *)0x0;
          local_e8.entire_unit_._M_len = 0;
          local_e8.entire_unit_._M_str = (char *)0x0;
          local_e8.unit_name_._M_dataplus._M_p = (pointer)&local_e8.unit_name_.field_2;
          local_e8.unit_name_._M_string_length = 0;
          local_e8.unit_name_.field_2._M_local_buf[0] = '\0';
          local_e8.strp_callback_._M_invoker = (_Invoker_type)0x0;
          local_e8.strp_callback_.super__Function_base._M_functor._8_8_ = 0;
          local_e8.strp_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
          local_e8.range_lists_base_ = 0;
          local_e8.strp_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
          local_e8.addr_base_ = 0;
          local_e8.str_offsets_base_ = 0;
          bVar3 = dwarf::CUIter::NextCU(&local_100,&local_238,&local_e8);
          if (bVar3) {
            std::__cxx11::string::_M_assign((string *)&local_2b8);
          }
          if (local_e8.strp_callback_.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_e8.strp_callback_.super__Function_base._M_manager)
                      ((_Any_data *)&local_e8.strp_callback_,(_Any_data *)&local_e8.strp_callback_,
                       __destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.unit_name_._M_dataplus._M_p != &local_e8.unit_name_.field_2) {
            operator_delete(local_e8.unit_name_._M_dataplus._M_p,
                            CONCAT71(local_e8.unit_name_.field_2._M_allocated_capacity._1_7_,
                                     local_e8.unit_name_.field_2._M_local_buf[0]) + 1);
          }
          local_270 = &local_260;
          if (bVar3) {
            if (local_2b8 == (long *)&local_2a8) {
              uStack_258 = uStack_2a0;
            }
            else {
              local_270 = local_2b8;
            }
            local_260 = CONCAT71(uStack_2a7,local_2a8);
            local_268 = local_2b0;
            local_2b0 = 0;
            local_2a8 = 0;
            local_2b8 = (long *)&local_2a8;
          }
          else {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_270,local_180,
                       (char *)((long)local_180 + (long)&local_178->debug_abbrev));
          }
          if (local_2b8 != (long *)&local_2a8) {
            operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
          }
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_270);
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
        }
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        pcVar1 = (this_00->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_290,pcVar1,pcVar1 + this_00->_M_string_length);
        while( true ) {
          bVar3 = dwarf::AddressRanges::NextRange(&local_160);
          if (!bVar3) break;
          bVar3 = dwarf::IsValidDwarfAddress
                            (local_160.address_,local_160.sizes_.addr8_ * '\x04' + '\x04');
          if (bVar3) {
            RangeSink::AddVMRangeIgnoreDuplicate
                      ((RangeSink *)skeleton,"dwarf_aranges",local_160.address_,local_160.length_,
                       &local_290);
          }
          pRVar2 = (RangeSink *)(skeleton->dwarf_->debug_info)._M_len;
          sink = (RangeSink *)local_160.data_._M_str;
          if ((pRVar2 <= local_160.data_._M_str) &&
             (local_160.data_._M_str <
              (RangeSink *)
              ((skeleton->dwarf_->debug_aranges)._M_str + -8 +
              (long)(&(pRVar2->options_)._has_bits_ + -4)))) {
            sink = (RangeSink *)((long)local_160.data_._M_str - (long)pRVar2);
            name._M_str = local_290._M_dataplus._M_p;
            name._M_len = local_290._M_string_length;
            RangeSink::AddFileRange
                      ((RangeSink *)skeleton,"dwarf_aranges_data",name,(uint64_t)sink,
                       local_160.data_._M_len);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_180 != local_170) {
        operator_delete(local_180,(ulong)((long)&(local_170[0]->debug_abbrev)._M_len + 1));
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1b8);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_238.abbrev_tables_._M_h);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_238.stmt_list_map_._M_h);
      symbol_map = (DualMap *)local_248;
      this = (bloaty *)local_250;
      file = local_240;
    }
    local_238.stmt_list_map_._M_h._M_buckets = &local_238.stmt_list_map_._M_h._M_single_bucket;
    local_238.stmt_list_map_._M_h._M_bucket_count = 1;
    local_238.stmt_list_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_238.stmt_list_map_._M_h._M_element_count = 0;
    local_238.stmt_list_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_238.stmt_list_map_._M_h._M_rehash_policy._M_next_resize = 0;
    local_238.stmt_list_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_238.abbrev_tables_._M_h._M_buckets = &local_238.abbrev_tables_._M_h._M_single_bucket;
    local_238.abbrev_tables_._M_h._M_bucket_count = 1;
    local_238.abbrev_tables_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_238.abbrev_tables_._M_h._M_element_count = 0;
    local_238.abbrev_tables_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_238.abbrev_tables_._M_h._M_rehash_policy._M_next_resize = 0;
    local_238.abbrev_tables_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_238.dwarf_ = (File *)this;
    local_238.skeleton_ = (CU *)symbol_map;
    ReadDWARFDebugInfo(&local_238,kDebugInfo,(DualMap *)file,(RangeSink *)skeleton);
    ReadDWARFDebugInfo(&local_238,kDebugTypes,(DualMap *)file,(RangeSink *)skeleton);
    section._M_str = (char *)skeleton;
    section._M_len = (size_t)(((File *)this)->debug_pubnames)._M_str;
    ReadDWARFPubNames((bloaty *)&local_238,(InfoReader *)(((File *)this)->debug_pubnames)._M_len,
                      section,sink);
    section_00._M_str = (char *)skeleton;
    section_00._M_len = (size_t)(((File *)this)->debug_pubtypes)._M_str;
    ReadDWARFPubNames((bloaty *)&local_238,(InfoReader *)(((File *)this)->debug_pubtypes)._M_len,
                      section_00,sink);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_238.abbrev_tables_._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_238.stmt_list_map_._M_h);
    return;
  }
  Throw("missing debug info",0x294);
}

Assistant:

void ReadDWARFCompileUnits(const dwarf::File& file, const DualMap& symbol_map,
                           const dwarf::CU* skeleton, RangeSink* sink) {
  if (!file.debug_info.size()) {
    THROW("missing debug info");
  }

  if (file.debug_aranges.size()) {
    ReadDWARFAddressRanges(file, sink);
  }

  // Share a reader to avoid re-parsing debug abbreviations.
  dwarf::InfoReader reader(file, skeleton);

  ReadDWARFDebugInfo(reader, dwarf::InfoReader::Section::kDebugInfo, symbol_map,
                     sink);
  ReadDWARFDebugInfo(reader, dwarf::InfoReader::Section::kDebugTypes,
                     symbol_map, sink);
  ReadDWARFPubNames(reader, file.debug_pubnames, sink);
  ReadDWARFPubNames(reader, file.debug_pubtypes, sink);
}